

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O1

int Llb_NonlinQuantify2(Llb_Mgr_t *p,Llb_Prt_t *pPart1,Llb_Prt_t *pPart2)

{
  uint uVar1;
  int iVar2;
  Llb_Var_t **ppLVar3;
  Llb_Var_t *pLVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int iVar7;
  DdNode *n;
  DdNode *n_00;
  Llb_Prt_t *pLVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  uint *__ptr;
  void *pvVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  int *piVar18;
  ulong uVar19;
  bool bVar20;
  
  n = Llb_NonlinCreateCube2(p,pPart1,pPart2);
  Cudd_Ref(n);
  n_00 = Cudd_bddAndAbstract(p->dd,pPart1->bFunc,pPart2->bFunc,n);
  if (n_00 == (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,n);
    iVar7 = 0;
  }
  else {
    Cudd_Ref(n_00);
    Cudd_RecursiveDeref(p->dd,n);
    pLVar8 = (Llb_Prt_t *)calloc(1,0x18);
    iVar7 = p->iPartFree;
    p->pParts[iVar7] = pLVar8;
    p->iPartFree = iVar7 + 1;
    pLVar8->iPart = iVar7;
    iVar7 = Cudd_DagSize(n_00);
    pLVar8->nSize = iVar7;
    pLVar8->bFunc = n_00;
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    pVVar9->nCap = 0x10;
    pVVar9->nSize = 0;
    piVar10 = (int *)malloc(0x40);
    pVVar9->pArray = piVar10;
    pLVar8->vVars = pVVar9;
    pVVar9 = pPart1->vVars;
    if (0 < pVVar9->nSize) {
      piVar10 = pVVar9->pArray;
      ppLVar3 = p->pVars;
      lVar14 = 0;
      do {
        pLVar4 = ppLVar3[piVar10[lVar14]];
        pVVar5 = pLVar4->vParts;
        uVar1 = pVVar5->nSize;
        uVar16 = 0;
        bVar20 = 0 < (int)uVar1;
        if (0 < (int)uVar1) {
          bVar20 = true;
          uVar16 = 0;
          if (*pVVar5->pArray != pPart1->iPart) {
            uVar19 = 0;
            do {
              if ((ulong)uVar1 - 1 == uVar19) {
                bVar20 = false;
                uVar16 = (ulong)uVar1;
                goto LAB_00827cb7;
              }
              uVar16 = uVar19 + 1;
              lVar17 = uVar19 + 1;
              uVar19 = uVar16;
            } while (pVVar5->pArray[lVar17] != pPart1->iPart);
            bVar20 = uVar16 < uVar1;
          }
        }
LAB_00827cb7:
        uVar15 = (uint)uVar16;
        if (uVar15 == uVar1) {
LAB_00828166:
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb3Image.c"
                        ,0x194,"int Llb_NonlinQuantify2(Llb_Mgr_t *, Llb_Prt_t *, Llb_Prt_t *)");
        }
        if (!bVar20) goto LAB_00828185;
        uVar13 = uVar1;
        if ((int)(uVar15 + 1) < (int)uVar1) {
          piVar6 = pVVar5->pArray;
          piVar18 = piVar6 + (uVar15 + 1);
          uVar16 = uVar16 & 0xffffffff;
          do {
            iVar7 = (int)uVar16;
            piVar6[uVar16] = *piVar18;
            uVar13 = pVVar5->nSize;
            piVar18 = piVar18 + 1;
            uVar16 = (ulong)(iVar7 + 1);
          } while (iVar7 + 2 < (int)uVar13);
        }
        pVVar5->nSize = uVar13 - 1;
        if (uVar15 == uVar1) goto LAB_00828166;
        piVar18 = &pLVar4->nScore;
        *piVar18 = *piVar18 - pPart1->nSize;
        lVar14 = lVar14 + 1;
      } while (lVar14 < pVVar9->nSize);
    }
    pVVar9 = pPart2->vVars;
    if (0 < pVVar9->nSize) {
      piVar10 = pVVar9->pArray;
      ppLVar3 = p->pVars;
      lVar14 = 0;
      do {
        pLVar4 = ppLVar3[piVar10[lVar14]];
        pVVar5 = pLVar4->vParts;
        uVar1 = pVVar5->nSize;
        uVar16 = 0;
        bVar20 = 0 < (int)uVar1;
        if (0 < (int)uVar1) {
          bVar20 = true;
          uVar16 = 0;
          if (*pVVar5->pArray != pPart2->iPart) {
            uVar19 = 0;
            do {
              if ((ulong)uVar1 - 1 == uVar19) {
                bVar20 = false;
                uVar16 = (ulong)uVar1;
                goto LAB_00827daf;
              }
              uVar16 = uVar19 + 1;
              lVar17 = uVar19 + 1;
              uVar19 = uVar16;
            } while (pVVar5->pArray[lVar17] != pPart2->iPart);
            bVar20 = uVar16 < uVar1;
          }
        }
LAB_00827daf:
        uVar15 = (uint)uVar16;
        if (uVar15 == uVar1) {
LAB_008281a4:
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb3Image.c"
                        ,0x19b,"int Llb_NonlinQuantify2(Llb_Mgr_t *, Llb_Prt_t *, Llb_Prt_t *)");
        }
        if (!bVar20) {
LAB_00828185:
          __assert_fail("i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x3dc,"int Vec_IntRemove(Vec_Int_t *, int)");
        }
        uVar13 = uVar1;
        if ((int)(uVar15 + 1) < (int)uVar1) {
          piVar6 = pVVar5->pArray;
          piVar18 = piVar6 + (uVar15 + 1);
          uVar16 = uVar16 & 0xffffffff;
          do {
            iVar7 = (int)uVar16;
            piVar6[uVar16] = *piVar18;
            uVar13 = pVVar5->nSize;
            piVar18 = piVar18 + 1;
            uVar16 = (ulong)(iVar7 + 1);
          } while (iVar7 + 2 < (int)uVar13);
        }
        pVVar5->nSize = uVar13 - 1;
        if (uVar15 == uVar1) goto LAB_008281a4;
        piVar18 = &pLVar4->nScore;
        *piVar18 = *piVar18 - pPart2->nSize;
        lVar14 = lVar14 + 1;
      } while (lVar14 < pVVar9->nSize);
    }
    Extra_SupportArray(p->dd,n_00,p->pSupp);
    if (p->nVars < 1) {
      iVar7 = 0;
    }
    else {
      lVar14 = 0;
      iVar7 = 0;
      do {
        iVar2 = p->pSupp[lVar14];
        if ((iVar2 != 0) && (p->pVars2Q[lVar14] != 0)) {
          pLVar4 = p->pVars[lVar14];
          piVar10 = &pLVar4->nScore;
          *piVar10 = *piVar10 + pLVar8->nSize;
          Vec_IntPush(pLVar4->vParts,pLVar8->iPart);
          Vec_IntPush(pLVar8->vVars,(int)lVar14);
        }
        iVar7 = iVar7 + iVar2;
        lVar14 = lVar14 + 1;
      } while (lVar14 < p->nVars);
    }
    if (iVar7 < p->nSuppMax) {
      iVar7 = p->nSuppMax;
    }
    p->nSuppMax = iVar7;
    __ptr = (uint *)malloc(0x10);
    __ptr[0] = 0;
    __ptr[1] = 0;
    __ptr[2] = 0;
    __ptr[3] = 0;
    pVVar9 = pPart1->vVars;
    if (0 < pVVar9->nSize) {
      lVar14 = 0;
      do {
        pVVar5 = p->pVars[pVVar9->pArray[lVar14]]->vParts;
        iVar7 = pVVar5->nSize;
        if (iVar7 == 1) {
          pLVar8 = p->pParts[*pVVar5->pArray];
          uVar1 = __ptr[1];
          lVar17 = (long)(int)uVar1;
          if (0 < lVar17) {
            lVar12 = 0;
            do {
              if (*(Llb_Prt_t **)(*(long *)(__ptr + 2) + lVar12 * 8) == pLVar8) goto LAB_00827fbb;
              lVar12 = lVar12 + 1;
            } while (lVar17 != lVar12);
          }
          uVar15 = *__ptr;
          if (uVar1 == uVar15) {
            if ((int)uVar15 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar11 = malloc(0x80);
              }
              else {
                pvVar11 = realloc(*(void **)(__ptr + 2),0x80);
              }
              uVar13 = 0x10;
            }
            else {
              uVar13 = uVar15 * 2;
              if ((int)uVar13 <= (int)uVar15) goto LAB_00827fa9;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar11 = malloc((ulong)uVar15 << 4);
              }
              else {
                pvVar11 = realloc(*(void **)(__ptr + 2),(ulong)uVar15 << 4);
              }
            }
            *(void **)(__ptr + 2) = pvVar11;
            *__ptr = uVar13;
          }
LAB_00827fa9:
          __ptr[1] = uVar1 + 1;
          *(Llb_Prt_t **)(*(long *)(__ptr + 2) + lVar17 * 8) = pLVar8;
        }
        else if (iVar7 == 0) {
          Llb_NonlinRemoveVar(p,p->pVars[pVVar9->pArray[lVar14]]);
        }
LAB_00827fbb:
        lVar14 = lVar14 + 1;
        pVVar9 = pPart1->vVars;
      } while (lVar14 < pVVar9->nSize);
    }
    pVVar9 = pPart2->vVars;
    if (0 < pVVar9->nSize) {
      lVar14 = 0;
      do {
        pLVar4 = p->pVars[pVVar9->pArray[lVar14]];
        if (pLVar4 != (Llb_Var_t *)0x0) {
          iVar7 = pLVar4->vParts->nSize;
          if (iVar7 == 1) {
            pLVar8 = p->pParts[*pLVar4->vParts->pArray];
            uVar1 = __ptr[1];
            lVar17 = (long)(int)uVar1;
            if (0 < lVar17) {
              lVar12 = 0;
              do {
                if (*(Llb_Prt_t **)(*(long *)(__ptr + 2) + lVar12 * 8) == pLVar8) goto LAB_008280cc;
                lVar12 = lVar12 + 1;
              } while (lVar17 != lVar12);
            }
            uVar15 = *__ptr;
            if (uVar1 == uVar15) {
              if ((int)uVar15 < 0x10) {
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar11 = malloc(0x80);
                }
                else {
                  pvVar11 = realloc(*(void **)(__ptr + 2),0x80);
                }
                uVar13 = 0x10;
              }
              else {
                uVar13 = uVar15 * 2;
                if ((int)uVar13 <= (int)uVar15) goto LAB_008280ba;
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar11 = malloc((ulong)uVar15 << 4);
                }
                else {
                  pvVar11 = realloc(*(void **)(__ptr + 2),(ulong)uVar15 << 4);
                }
              }
              *(void **)(__ptr + 2) = pvVar11;
              *__ptr = uVar13;
            }
LAB_008280ba:
            __ptr[1] = uVar1 + 1;
            *(Llb_Prt_t **)(*(long *)(__ptr + 2) + lVar17 * 8) = pLVar8;
          }
          else if (iVar7 == 0) {
            Llb_NonlinRemoveVar(p,pLVar4);
          }
        }
LAB_008280cc:
        lVar14 = lVar14 + 1;
        pVVar9 = pPart2->vVars;
      } while (lVar14 < pVVar9->nSize);
    }
    Llb_NonlinRemovePart(p,pPart1);
    Llb_NonlinRemovePart(p,pPart2);
    uVar1 = __ptr[1];
    if (0 < (long)(int)uVar1) {
      lVar14 = *(long *)(__ptr + 2);
      lVar17 = 0;
      do {
        Llb_NonlinQuantify1(p,*(Llb_Prt_t **)(lVar14 + lVar17 * 8),0);
        lVar17 = lVar17 + 1;
      } while ((int)uVar1 != lVar17);
    }
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
      __ptr[2] = 0;
      __ptr[3] = 0;
    }
    free(__ptr);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int Llb_NonlinQuantify2( Llb_Mgr_t * p, Llb_Prt_t * pPart1, Llb_Prt_t * pPart2 )
{
    int fVerbose = 0;
    Llb_Var_t * pVar;
    Llb_Prt_t * pTemp;
    Vec_Ptr_t * vSingles;
    DdNode * bCube, * bFunc;
    int i, RetValue, nSuppSize;
//    int iPart1 = pPart1->iPart;
//    int iPart2 = pPart2->iPart;

    // create cube to be quantified
    bCube = Llb_NonlinCreateCube2( p, pPart1, pPart2 );   Cudd_Ref( bCube );
if ( fVerbose )
{
printf( "\n" );
printf( "\n" );
Llb_NonlinPrint( p );
printf( "Conjoining partitions %d and %d.\n", pPart1->iPart, pPart2->iPart );
Extra_bddPrintSupport( p->dd, bCube );  printf( "\n" );
}
 
    // derive new function
//    bFunc = Cudd_bddAndAbstract( p->dd, pPart1->bFunc, pPart2->bFunc, bCube );  Cudd_Ref( bFunc );
/*
    bFunc = Cudd_bddAndAbstractLimit( p->dd, pPart1->bFunc, pPart2->bFunc, bCube, Limit );  
    if ( bFunc == NULL )
    {
        int RetValue;
        Cudd_RecursiveDeref( p->dd, bCube );
        if ( pPart1->nSize < pPart2->nSize )
            RetValue = Llb_NonlinQuantify1( p, pPart1, 1 );
        else
            RetValue = Llb_NonlinQuantify1( p, pPart2, 1 );
        if ( RetValue )
            Limit = Limit + 1000;
        Llb_NonlinQuantify2( p, pPart1, pPart2 );
        return 0;
    }
    Cudd_Ref( bFunc );
*/

//    bFunc = Extra_bddAndAbstractTime( p->dd, pPart1->bFunc, pPart2->bFunc, bCube, TimeOut );  
    bFunc = Cudd_bddAndAbstract( p->dd, pPart1->bFunc, pPart2->bFunc, bCube );  
    if ( bFunc == NULL )
    {
        Cudd_RecursiveDeref( p->dd, bCube );
        return 0;
    }
    Cudd_Ref( bFunc );
    Cudd_RecursiveDeref( p->dd, bCube );

    // create new partition
    pTemp = p->pParts[p->iPartFree] = ABC_CALLOC( Llb_Prt_t, 1 );
    pTemp->iPart = p->iPartFree++;
    pTemp->nSize = Cudd_DagSize(bFunc);
    pTemp->bFunc = bFunc;
    pTemp->vVars = Vec_IntAlloc( 8 );
    // update variables
    Llb_PartForEachVar( p, pPart1, pVar, i )
    {
        RetValue = Vec_IntRemove( pVar->vParts, pPart1->iPart );
        assert( RetValue );
        pVar->nScore -= pPart1->nSize;
    }
    // update variables
    Llb_PartForEachVar( p, pPart2, pVar, i )
    {
        RetValue = Vec_IntRemove( pVar->vParts, pPart2->iPart );
        assert( RetValue );
        pVar->nScore -= pPart2->nSize;
    }
    // add variables to the new partition
    nSuppSize = 0;
    Extra_SupportArray( p->dd, bFunc, p->pSupp );
    for ( i = 0; i < p->nVars; i++ )
    {
        nSuppSize += p->pSupp[i];
        if ( p->pSupp[i] && p->pVars2Q[i] )
        {
            pVar = Llb_MgrVar( p, i );
            pVar->nScore += pTemp->nSize;
            Vec_IntPush( pVar->vParts, pTemp->iPart );
            Vec_IntPush( pTemp->vVars, i );
        }
    }
    p->nSuppMax = Abc_MaxInt( p->nSuppMax, nSuppSize ); 
    // remove variables and collect partitions with singleton variables
    vSingles = Vec_PtrAlloc( 0 );
    Llb_PartForEachVar( p, pPart1, pVar, i )
    {
        if ( Vec_IntSize(pVar->vParts) == 0 )
            Llb_NonlinRemoveVar( p, pVar );
        else if ( Vec_IntSize(pVar->vParts) == 1 )
        {
            if ( fVerbose )
                printf( "Adding partition %d because of var %d.\n", 
                    Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0))->iPart, pVar->iVar );
            Vec_PtrPushUnique( vSingles, Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0)) );
        }
    }
    Llb_PartForEachVar( p, pPart2, pVar, i )
    {
        if ( pVar == NULL )
            continue;
        if ( Vec_IntSize(pVar->vParts) == 0 )
            Llb_NonlinRemoveVar( p, pVar );
        else if ( Vec_IntSize(pVar->vParts) == 1 )
        {
            if ( fVerbose )
                printf( "Adding partition %d because of var %d.\n", 
                    Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0))->iPart, pVar->iVar );
            Vec_PtrPushUnique( vSingles, Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0)) );
        }
    }
    // remove partitions
    Llb_NonlinRemovePart( p, pPart1 );
    Llb_NonlinRemovePart( p, pPart2 );
    // remove other variables
if ( fVerbose )
Llb_NonlinPrint( p );
    Vec_PtrForEachEntry( Llb_Prt_t *, vSingles, pTemp, i )
    {
if ( fVerbose )
printf( "Updating partitiong %d with singlton vars.\n", pTemp->iPart );
        Llb_NonlinQuantify1( p, pTemp, 0 );
    }
if ( fVerbose )
Llb_NonlinPrint( p );
    Vec_PtrFree( vSingles );
    return 1;
}